

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

void idx2::RemoveDir(cstr Path)

{
  bool bVar1;
  size_t sVar2;
  dirent *pdVar3;
  DIR *__dirp;
  FILE *__stream;
  FILE *File;
  DIR *SubDir;
  char AbsPath [257];
  DIR *Dir;
  dirent *Entry;
  int local_28;
  cstr local_20;
  cstr Path_local;
  dirent **local_10;
  
  local_10 = &Entry;
  local_20 = Path;
  Path_local = Path;
  Entry = (dirent *)Path;
  sVar2 = strlen(Path);
  local_28 = (int)sVar2;
  bVar1 = DirExists((stref *)&Entry);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    stack0xffffffffffffffc0 = (DIR *)0x0;
    register0x00000000 = opendir(local_20);
    memset(&SubDir,0,0x101);
    while (pdVar3 = readdir(stack0xffffffffffffffc0), pdVar3 != (dirent *)0x0) {
      if (pdVar3->d_name[0] != '.') {
        sprintf((char *)&SubDir,"%s/%s",local_20,pdVar3->d_name);
        __dirp = opendir((char *)&SubDir);
        if (__dirp == (DIR *)0x0) {
          __stream = fopen((char *)&SubDir,"r");
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
            remove((char *)&SubDir);
          }
        }
        else {
          closedir(__dirp);
          RemoveDir((cstr)&SubDir);
        }
      }
    }
    remove(local_20);
  }
  return;
}

Assistant:

void
RemoveDir(cstr Path)
{
  if (!DirExists(Path))
    return;

  struct dirent* Entry = nullptr;
  DIR* Dir = nullptr;
  Dir = opendir(Path);
  char AbsPath[257] = { 0 };

  while (Entry = readdir(Dir))
  {
    if (*(Entry->d_name) == '.')
      continue;

    DIR* SubDir = nullptr;
    FILE* File = nullptr;
    sprintf(AbsPath, "%s/%s", Path, Entry->d_name);
    if (SubDir = opendir(AbsPath))
    {
      closedir(SubDir);
      RemoveDir(AbsPath);
    }
    else if (File = fopen(AbsPath, "r"))
    {
      fclose(File);
      remove(AbsPath);
    }
  }

  remove(Path);
}